

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.hpp
# Opt level: O1

void __thiscall qclab::qgates::RotationY<double>::RotationY(RotationY<double> *this,real_type theta)

{
  double dVar1;
  
  (this->super_QRotationGate1<double>).super_QGate1<double>.qubit_ = 0;
  (this->super_QRotationGate1<double>).super_QGate1<double>.field_0xc = 0;
  (this->super_QRotationGate1<double>).super_QGate1<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0013b770;
  dVar1 = ::cos(theta * 0.5);
  (this->super_QRotationGate1<double>).rotation_.angle_.cos_ = dVar1;
  dVar1 = ::sin(theta * 0.5);
  (this->super_QRotationGate1<double>).rotation_.angle_.sin_ = dVar1;
  (this->super_QRotationGate1<double>).super_QGate1<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0013b610;
  return;
}

Assistant:

RotationY( const real_type theta )
        : QRotationGate1< T >( 0 , theta )
        { }